

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void read_bytes<unsigned_long,unsigned_int>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *vec,size_t n_els,char **in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  byte bVar1;
  size_type sVar2;
  vector<char,_std::allocator<char>_> *in_RCX;
  long *in_RDX;
  size_t in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  byte in_R8B;
  undefined7 unaff_retaddr;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_R8B & 1;
  if (in_RSI == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x669546);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x669550);
  }
  else {
    sVar2 = std::vector<char,_std::allocator<char>_>::size(in_RCX);
    if (sVar2 < in_RSI << 2) {
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)CONCAT17(diff_endian,unaff_retaddr),
                 (size_type)in_RDI);
    }
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x6694d5);
    read_bytes<unsigned_int>(in_RCX,CONCAT17(bVar1,in_stack_ffffffffffffffd8),(char **)0x6694e7);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(diff_endian,unaff_retaddr),(size_type)in_RDI);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::shrink_to_fit
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x669500);
    if ((bVar1 & 1) != 0) {
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x669511);
      swap_endianness<unsigned_int>((uint *)in_RCX,CONCAT17(bVar1,in_stack_ffffffffffffffd8));
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x669528);
    convert_dtype<unsigned_long,unsigned_int>
              ((void *)CONCAT17(diff_endian,unaff_retaddr),in_RDI,in_RSI);
  }
  *in_RDX = in_RSI * 4 + *in_RDX;
  return;
}

Assistant:

void read_bytes(std::vector<dtype> &vec, const size_t n_els, const char *&in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(vec, n_els, in);
        if (unlikely(diff_endian)) swap_endianness(vec.data(), n_els);
        return;
    }
    if (n_els) {
        if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
            buffer.resize((size_t)2 * n_els * sizeof(saved_type));
        read_bytes<saved_type>(buffer.data(), n_els, in);
        vec.resize(n_els);
        vec.shrink_to_fit();
        
        if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
        convert_dtype<dtype, saved_type>(vec.data(), buffer, n_els);
    }
    
    else {
        vec.clear();
        vec.shrink_to_fit();
    }

    in += n_els * sizeof(saved_type);
}